

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_stats(REF_INTERP ref_interp)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  REF_INT extrapolate;
  REF_DBL min_bary;
  REF_DBL max_error;
  int local_24;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar2 = ref_interp->to_grid->node;
  extrapolate = 0;
  if (ref_mpi->id == 0) {
    if (0 < ref_interp->n_tree) {
      printf("tree search: %d found, %.2f avg cells\n",
             (double)ref_interp->tree_cells / (double)ref_interp->n_tree);
    }
    if (0 < ref_interp->n_terminated || 0 < ref_interp->n_walk) {
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             (double)ref_interp->walk_steps / (double)ref_interp->n_walk);
    }
    printf("geom nodes: %d failed, %d successful\n",(ulong)(uint)ref_interp->n_geom_fail,
           (ulong)(uint)ref_interp->n_geom);
  }
  lVar6 = 0x18;
  local_24 = 0;
  for (lVar5 = 0; lVar5 < pRVar2->max; lVar5 = lVar5 + 1) {
    if ((-1 < pRVar2->global[lVar5]) && (pRVar2->ref_mpi->id == pRVar2->part[lVar5])) {
      pRVar3 = ref_interp->bary;
      dVar9 = *(double *)((long)pRVar3 + lVar6 + -0x18);
      dVar10 = *(double *)((long)pRVar3 + lVar6 + -8);
      dVar1 = *(double *)((long)pRVar3 + lVar6 + -0x10);
      if (dVar1 <= dVar9) {
        dVar9 = dVar1;
      }
      if (*(double *)((long)pRVar3 + lVar6) <= dVar10) {
        dVar10 = *(double *)((long)pRVar3 + lVar6);
      }
      if (dVar10 <= dVar9) {
        dVar9 = dVar10;
      }
      if (dVar9 < ref_interp->inside) {
        local_24 = local_24 + 1;
        extrapolate = local_24;
      }
    }
    lVar6 = lVar6 + 0x20;
  }
  uVar4 = ref_mpi_sum(ref_mpi,&local_24,&extrapolate,1,1);
  if (uVar4 == 0) {
    uVar4 = ref_interp_max_error(ref_interp,&max_error);
    if (uVar4 == 0) {
      uVar4 = ref_interp_min_bary(ref_interp,&min_bary);
      if (uVar4 == 0) {
        if (ref_mpi->id != 0) {
          return 0;
        }
        printf("interp min bary %e max error %e extrap %d\n",min_bary,max_error,
               (ulong)(uint)extrapolate);
        return 0;
      }
      pcVar8 = "mb";
      uVar7 = 0x9c8;
    }
    else {
      pcVar8 = "me";
      uVar7 = 0x9c7;
    }
  }
  else {
    pcVar8 = "sum";
    uVar7 = 0x9c5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
         "ref_interp_stats",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_interp_stats(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT extrapolate = 0;
  REF_INT node;
  REF_DBL this_bary, max_error, min_bary;

  if (ref_mpi_once(ref_mpi)) {
    if (ref_interp->n_tree > 0)
      printf("tree search: %d found, %.2f avg cells\n", ref_interp->n_tree,
             (REF_DBL)ref_interp->tree_cells / (REF_DBL)ref_interp->n_tree);
    if (ref_interp->n_walk > 0 || ref_interp->n_terminated > 0)
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             ref_interp->n_walk,
             (REF_DBL)ref_interp->walk_steps / (REF_DBL)ref_interp->n_walk,
             ref_interp->n_terminated);
    printf("geom nodes: %d failed, %d successful\n", ref_interp->n_geom_fail,
           ref_interp->n_geom);
  }

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    this_bary = MIN(
        MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
        MIN(ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]));
    if (this_bary < ref_interp->inside) extrapolate++;
  }
  node = extrapolate;
  RSS(ref_mpi_sum(ref_mpi, &node, &extrapolate, 1, REF_INT_TYPE), "sum");

  RSS(ref_interp_max_error(ref_interp, &max_error), "me");
  RSS(ref_interp_min_bary(ref_interp, &min_bary), "mb");

  if (ref_mpi_once(ref_mpi)) {
    printf("interp min bary %e max error %e extrap %d\n", min_bary, max_error,
           extrapolate);
  }

  return REF_SUCCESS;
}